

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O0

void __thiscall TPZPostProcAnalysis::TransferSolution(TPZPostProcAnalysis *this)

{
  TPZCompMesh *this_00;
  TPZCompMesh *this_01;
  TPZFMatrix<double> *pTVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<double> *this_02;
  TPZCompEl *this_03;
  int64_t col;
  double *pdVar4;
  TPZCompMesh *in_RDI;
  double extraout_XMM0_Qa;
  int64_t isol;
  int64_t index;
  TPZCompEl *cel;
  TPZGeoEl *gel;
  TPZCompEl *celpost;
  int64_t el;
  int64_t nelem;
  int64_t numelsol;
  TPZFMatrix<double> *solmeshElSol;
  TPZFMatrix<double> *comprefElSol;
  TPZCompMesh *solmesh;
  TPZCompMesh *compmeshPostProcess;
  TPZLinearAnalysis *in_stack_000001e0;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  double in_stack_ffffffffffffff88;
  TPZSolutionMatrix *in_stack_ffffffffffffff98;
  TPZCompMesh *in_stack_ffffffffffffffa0;
  long local_40;
  
  TPZLinearAnalysis::AssembleResidual(in_stack_000001e0);
  TPZLinearAnalysis::Rhs((TPZLinearAnalysis *)in_RDI);
  TPZSolutionMatrix::operator=(in_stack_ffffffffffffff98,(TPZSolutionMatrix *)in_RDI);
  TPZAnalysis::LoadSolution((TPZAnalysis *)in_RDI);
  this_01 = TPZAnalysis::Mesh((TPZAnalysis *)in_RDI);
  if (this_01 == (TPZCompMesh *)0x0) {
    pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
  }
  this_00 = (TPZCompMesh *)(in_RDI->fSolution).fComplexMatrix.fWork.fStore;
  TPZCompMesh::Reference((TPZCompMesh *)(in_RDI->fSolution).fComplexMatrix.fWork.fStore);
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_ffffffffffffffa0);
  TPZCompMesh::LoadReferences(in_stack_ffffffffffffffa0);
  TPZCompMesh::ElementSolution(this_01);
  TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)in_RDI);
  TPZCompMesh::ElementSolution(this_00);
  pTVar1 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)in_RDI);
  TPZCompMesh::ElementSolution(this_00);
  iVar2 = TPZSolutionMatrix::Cols((TPZSolutionMatrix *)0x1c9ed4b);
  iVar3 = TPZCompMesh::NElements((TPZCompMesh *)0x1c9ed5a);
  TPZCompMesh::ElementSolution(this_01);
  TPZSolutionMatrix::Redim
            (in_stack_ffffffffffffff98,(int64_t)in_RDI,(int64_t)in_stack_ffffffffffffff88);
  if (iVar2 != 0) {
    for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
      TPZCompMesh::Element(in_RDI,(int64_t)in_stack_ffffffffffffff88);
      this_02 = (TPZFMatrix<double> *)TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffff98);
      if (this_02 == (TPZFMatrix<double> *)0x0) {
        pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
      }
      this_03 = TPZGeoEl::Reference((TPZGeoEl *)this_02);
      if (this_03 == (TPZCompEl *)0x0) {
        pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
      }
      col = TPZCompEl::Index(this_03);
      for (in_stack_ffffffffffffff98 = (TPZSolutionMatrix *)0x0;
          (long)in_stack_ffffffffffffff98 < iVar2;
          in_stack_ffffffffffffff98 =
               (TPZSolutionMatrix *)
               ((long)&(in_stack_ffffffffffffff98->super_TPZSavable)._vptr_TPZSavable + 1)) {
        (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x21])(pTVar1,col,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff88 = extraout_XMM0_Qa;
        pdVar4 = TPZFMatrix<double>::operator()(this_02,(int64_t)this_03,col);
        *pdVar4 = in_stack_ffffffffffffff88;
      }
    }
  }
  return;
}

Assistant:

void TPZPostProcAnalysis::TransferSolution()
{

    // this is where we compute the projection of the post processed variables
    TPZLinearAnalysis::AssembleResidual();
    fSolution = Rhs();
    TPZLinearAnalysis::LoadSolution();
    
    TPZCompMesh *compmeshPostProcess = (Mesh());
    if (!compmeshPostProcess) {
        DebugStop();
    }
    // fpMainMesh is the mesh with the actual finite element approximation, but probably stored at
    // integration points
    TPZCompMesh *solmesh = fpMainMesh;
    fpMainMesh->Reference()->ResetReference();
    fpMainMesh->LoadReferences();
    //In case the post processing computed element solutions
    // copy the values from the post processing mesh to the finite element mesh
    TPZFMatrix<STATE> &comprefElSol = compmeshPostProcess->ElementSolution();
    // solmesh if the finite element simulation mesh
    const TPZFMatrix<STATE> &solmeshElSol = solmesh->ElementSolution();
    int64_t numelsol = solmesh->ElementSolution().Cols();
    int64_t nelem = compmeshPostProcess->NElements();
    compmeshPostProcess->ElementSolution().Redim(nelem, numelsol);
    if (numelsol) 
    {
        for (int64_t el=0; el<nelem; el++) {
            TPZCompEl *celpost = compmeshPostProcess->Element(el);
            TPZGeoEl *gel = celpost->Reference();
            // we dont acount for condensed elements submeshes etc
            if(!gel) DebugStop();
            TPZCompEl *cel = gel->Reference();
            if (!cel) {
                DebugStop();
            }
            int64_t index = cel->Index();
            // we copy from the simulation mesh to the post processing mesh
            for (int64_t isol=0; isol<numelsol; isol++) {
                comprefElSol(el,isol) = solmeshElSol.Get(index,isol);
            }
        }
    }
}